

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

int __thiscall
yy::mylanguage_parser::yy_syntax_error_arguments_
          (mylanguage_parser *this,context *yyctx,symbol_kind_type *yyarg,int yyargn)

{
  symbol_kind_type sVar1;
  int iVar2;
  symbol_kind_type *yyarg_00;
  
  sVar1 = (yyctx->yyla_->super_basic_symbol<yy::mylanguage_parser::by_kind>).super_by_kind.kind_;
  iVar2 = 0;
  if (sVar1 != S_YYEMPTY) {
    if (yyarg != (symbol_kind_type *)0x0) {
      *yyarg = sVar1;
    }
    yyarg_00 = yyarg + 1;
    if (yyarg == (symbol_kind_type *)0x0) {
      yyarg_00 = (symbol_kind_type *)0x0;
    }
    iVar2 = context::expected_tokens(yyctx,yyarg_00,yyargn + -1);
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

const symbol_type& lookahead () const YY_NOEXCEPT { return yyla_; }